

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-shutdown-after-write.c
# Opt level: O1

void timer_cb(uv_timer_t *handle)

{
  int iVar1;
  char *in_RSI;
  
  if (handle == &timer) {
    uv_walk(timer.loop,walk_cb,magic_cookie);
    uv_close(&timer,0);
    return;
  }
  timer_cb_cold_1();
  if (in_RSI == magic_cookie) {
    if (handle == &timer) {
      seen_timer_handle = seen_timer_handle + 1;
      return;
    }
  }
  else {
    walk_cb_cold_1();
  }
  walk_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,0);
  return;
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  uv_buf_t buf;
  int r;

  uv_close((uv_handle_t*)handle, close_cb);

  buf = uv_buf_init("TEST", 4);
  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT(r == 0);

  r = uv_shutdown(&shutdown_req, (uv_stream_t*)&conn, shutdown_cb);
  ASSERT(r == 0);
}